

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::DWARFDebugRnglist>::~Expected(Expected<llvm::DWARFDebugRnglist> *this)

{
  error_type *this_00;
  _Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *this_01;
  
  if ((this->field_0x18 & 1) != 0) {
    this_00 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_00);
    return;
  }
  this_01 = (_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
            getStorage(this);
  std::_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::~_Vector_base
            (this_01);
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }